

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

bool __thiscall
llvm::
DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
::LookupBucketFor<llbuild::core::KeyID>
          (DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
           *this,KeyID *Val,DenseMapPair<llbuild::core::KeyID,_DBKeyID> **FoundBucket)

{
  ValueTy VVar1;
  ValueTy VVar2;
  bool bVar3;
  long lVar4;
  uint uVar5;
  DenseMapPair<llbuild::core::KeyID,_DBKeyID> *pDVar6;
  int iVar7;
  DenseMapPair<llbuild::core::KeyID,_DBKeyID> *pDVar8;
  
  if (*(int *)(this + 0x10) == 0) {
    pDVar8 = (DenseMapPair<llbuild::core::KeyID,_DBKeyID> *)0x0;
LAB_001b133a:
    bVar3 = false;
  }
  else {
    VVar1 = Val->_value;
    if (VVar1 + 1 < 2) {
      __assert_fail("!KeyInfoT::isEqual(Val, EmptyKey) && !KeyInfoT::isEqual(Val, TombstoneKey) && \"Empty/Tombstone value shouldn\'t be inserted into map!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                    ,0x24d,
                    "bool llvm::DenseMapBase<llvm::DenseMap<llbuild::core::KeyID, DBKeyID>, llbuild::core::KeyID, DBKeyID, llvm::DenseMapInfo<llbuild::core::KeyID>, llvm::detail::DenseMapPair<llbuild::core::KeyID, DBKeyID>>::LookupBucketFor(const LookupKeyT &, const BucketT *&) const [DerivedT = llvm::DenseMap<llbuild::core::KeyID, DBKeyID>, KeyT = llbuild::core::KeyID, ValueT = DBKeyID, KeyInfoT = llvm::DenseMapInfo<llbuild::core::KeyID>, BucketT = llvm::detail::DenseMapPair<llbuild::core::KeyID, DBKeyID>, LookupKeyT = llbuild::core::KeyID]"
                   );
    }
    uVar5 = (int)VVar1 * 0x25;
    iVar7 = 1;
    pDVar6 = (DenseMapPair<llbuild::core::KeyID,_DBKeyID> *)0x0;
    while( true ) {
      uVar5 = uVar5 & *(int *)(this + 0x10) - 1U;
      lVar4 = (ulong)uVar5 * 0x10;
      pDVar8 = (DenseMapPair<llbuild::core::KeyID,_DBKeyID> *)(*(long *)this + lVar4);
      VVar2 = *(ValueTy *)(*(long *)this + lVar4);
      bVar3 = true;
      if (VVar1 == VVar2) break;
      if (VVar2 == 0) {
        if (pDVar6 != (DenseMapPair<llbuild::core::KeyID,_DBKeyID> *)0x0) {
          pDVar8 = pDVar6;
        }
        goto LAB_001b133a;
      }
      if (VVar2 == 0xffffffffffffffff &&
          pDVar6 == (DenseMapPair<llbuild::core::KeyID,_DBKeyID> *)0x0) {
        pDVar6 = pDVar8;
      }
      uVar5 = uVar5 + iVar7;
      iVar7 = iVar7 + 1;
    }
  }
  *FoundBucket = pDVar8;
  return bVar3;
}

Assistant:

unsigned getNumBuckets() const {
    return NumBuckets;
  }